

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

parsed_pe * peparse::ParsePEFromBuffer(bounded_buffer *buffer)

{
  bool bVar1;
  parsed_pe *ppVar2;
  parsed_pe_internal *__s;
  bounded_buffer *in_RDI;
  parsed_pe *in_stack_00000098;
  vector<peparse::section,_std::allocator<peparse::section>_> *in_stack_000000e0;
  nt_header_32 *in_stack_000000e8;
  bounded_buffer *in_stack_000000f0;
  bounded_buffer *in_stack_000000f8;
  parsed_pe *in_stack_00000188;
  bounded_buffer *file;
  bounded_buffer *remaining;
  parsed_pe *in_stack_00000238;
  parsed_pe *p;
  parsed_pe *in_stack_00000468;
  parsed_pe_internal *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_fffffffffffffd58;
  string *__lhs;
  vector<peparse::section,_std::allocator<peparse::section>_> *in_stack_fffffffffffffd60;
  vector<peparse::section,_std::allocator<peparse::section>_> *in_stack_fffffffffffffd98;
  vector<peparse::section,_std::allocator<peparse::section>_> *in_stack_fffffffffffffda0;
  parsed_pe_internal *local_248;
  parsed_pe *local_230;
  string local_228 [8];
  vector<peparse::resource,_std::allocator<peparse::resource>_> *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  parsed_pe *in_stack_fffffffffffffdf8;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [24];
  parsed_pe *in_stack_fffffffffffffe90;
  string local_168 [16];
  bounded_buffer **in_stack_fffffffffffffea8;
  pe_header *in_stack_fffffffffffffeb0;
  bounded_buffer *in_stack_fffffffffffffeb8;
  _func_ios_base_ptr_ios_base_ptr *in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffefc;
  string local_f0 [32];
  bounded_buffer *local_d0;
  undefined8 local_c8;
  string local_c0 [32];
  string local_a0 [39];
  undefined1 local_79;
  parsed_pe_internal *local_78;
  string local_60 [32];
  string local_40 [39];
  undefined1 local_19;
  parsed_pe *local_18;
  bounded_buffer *local_10;
  parsed_pe *local_8;
  
  local_10 = in_RDI;
  ppVar2 = (parsed_pe *)operator_new(0x270,(nothrow_t *)&std::nothrow);
  local_19 = 0;
  local_230 = (parsed_pe *)0x0;
  if (ppVar2 != (parsed_pe *)0x0) {
    local_19 = 1;
    memset(ppVar2,0,0x270);
    _parsed_pe::_parsed_pe((_parsed_pe *)0x149bcc);
    local_230 = ppVar2;
  }
  local_18 = local_230;
  if (local_230 == (parsed_pe *)0x0) {
    err = 1;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    to_string<unsigned_int>(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
    std::operator+(in_stack_fffffffffffffd58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd50);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    local_8 = (parsed_pe *)0x0;
  }
  else {
    local_230->fileBuffer = local_10;
    __s = (parsed_pe_internal *)operator_new(0xa8,(nothrow_t *)&std::nothrow);
    local_79 = 0;
    local_248 = (parsed_pe_internal *)0x0;
    if (__s != (parsed_pe_internal *)0x0) {
      local_79 = 1;
      local_78 = __s;
      memset(__s,0,0xa8);
      parsed_pe_internal::parsed_pe_internal(in_stack_fffffffffffffd50);
      local_248 = __s;
    }
    local_18->internal = local_248;
    if (local_18->internal == (parsed_pe_internal *)0x0) {
      deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
      ppVar2 = local_18;
      if (local_18 != (parsed_pe *)0x0) {
        _parsed_pe::~_parsed_pe((_parsed_pe *)0x149da5);
        operator_delete(ppVar2,0x270);
      }
      err = 1;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      to_string<unsigned_int>(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
      std::operator+(in_stack_fffffffffffffd58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd50);
      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      local_8 = (parsed_pe *)0x0;
    }
    else {
      local_c8 = 0;
      bVar1 = getHeader(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffea8);
      if (bVar1) {
        local_d0 = local_18->fileBuffer;
        bVar1 = getSections(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0)
        ;
        if (bVar1) {
          std::vector<peparse::section,_std::allocator<peparse::section>_>::vector
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          bVar1 = getResources((bounded_buffer *)in_stack_fffffffffffffdf8,
                               (bounded_buffer *)in_stack_fffffffffffffdf0,
                               (vector<peparse::section,_std::allocator<peparse::section>_> *)
                               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          std::vector<peparse::section,_std::allocator<peparse::section>_>::~vector
                    (in_stack_fffffffffffffd60);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            bVar1 = getExports(in_stack_00000188);
            if (bVar1) {
              bVar1 = getRelocations(in_stack_fffffffffffffdf8);
              if (bVar1) {
                bVar1 = getDebugDir(in_stack_00000098);
                if (bVar1) {
                  bVar1 = getImports(in_stack_00000238);
                  if (bVar1) {
                    bVar1 = getSymbolTable(in_stack_00000468);
                    if (bVar1) {
                      deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
                      local_8 = local_18;
                    }
                    else {
                      deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
                      DestructParsedPE(in_stack_fffffffffffffe90);
                      local_8 = (parsed_pe *)0x0;
                    }
                  }
                  else {
                    deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
                    DestructParsedPE(in_stack_fffffffffffffe90);
                    local_8 = (parsed_pe *)0x0;
                  }
                }
                else {
                  deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
                  DestructParsedPE(in_stack_fffffffffffffe90);
                  err = 9;
                  std::__cxx11::string::assign(err_loc_abi_cxx11_);
                  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_228;
                  to_string<unsigned_int>(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
                  std::operator+(in_stack_fffffffffffffd58,__rhs);
                  std::__cxx11::string::operator+=
                            ((string *)err_loc_abi_cxx11_,(string *)&stack0xfffffffffffffdf8);
                  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
                  std::__cxx11::string::~string(local_228);
                  local_8 = (parsed_pe *)0x0;
                }
              }
              else {
                deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
                DestructParsedPE(in_stack_fffffffffffffe90);
                err = 9;
                std::__cxx11::string::assign(err_loc_abi_cxx11_);
                __lhs = local_1e8;
                to_string<unsigned_int>(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
                std::operator+((char *)__lhs,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd50);
                std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_1c8);
                std::__cxx11::string::~string(local_1c8);
                std::__cxx11::string::~string(local_1e8);
                local_8 = (parsed_pe *)0x0;
              }
            }
            else {
              deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
              DestructParsedPE(in_stack_fffffffffffffe90);
              err = 9;
              std::__cxx11::string::assign(err_loc_abi_cxx11_);
              to_string<unsigned_int>(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
              std::operator+(in_stack_fffffffffffffd58,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd50);
              std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_188);
              std::__cxx11::string::~string(local_188);
              std::__cxx11::string::~string(local_1a8);
              local_8 = (parsed_pe *)0x0;
            }
          }
          else {
            deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
            DestructParsedPE(in_stack_fffffffffffffe90);
            err = 4;
            std::__cxx11::string::assign(err_loc_abi_cxx11_);
            to_string<unsigned_int>(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
            std::operator+(in_stack_fffffffffffffd58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd50);
            std::__cxx11::string::operator+=
                      ((string *)err_loc_abi_cxx11_,(string *)&stack0xfffffffffffffeb8);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
            std::__cxx11::string::~string(local_168);
            local_8 = (parsed_pe *)0x0;
          }
        }
        else {
          deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
          DestructParsedPE(in_stack_fffffffffffffe90);
          err = 3;
          std::__cxx11::string::assign(err_loc_abi_cxx11_);
          to_string<unsigned_int>(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
          std::operator+(in_stack_fffffffffffffd58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd50);
          std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,local_f0);
          std::__cxx11::string::~string(local_f0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
          local_8 = (parsed_pe *)0x0;
        }
      }
      else {
        deleteBuffer((bounded_buffer *)in_stack_fffffffffffffd50);
        DestructParsedPE(in_stack_fffffffffffffe90);
        local_8 = (parsed_pe *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

parsed_pe *ParsePEFromBuffer(bounded_buffer *buffer) {
  // First, create a new parsed_pe structure
  // We pass std::nothrow parameter to new so in case of failure it returns
  // nullptr instead of throwing exception std::bad_alloc.
  parsed_pe *p = new (std::nothrow) parsed_pe();

  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  // Make a new buffer object to hold just our file data
  p->fileBuffer = buffer;

  p->internal = new (std::nothrow) parsed_pe_internal();

  if (p->internal == nullptr) {
    deleteBuffer(p->fileBuffer);
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  // get header information
  bounded_buffer *remaining = nullptr;
  if (!getHeader(p->fileBuffer, p->peHeader, remaining)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    // err is set by getHeader
    return nullptr;
  }

  bounded_buffer *file = p->fileBuffer;
  if (!getSections(remaining, file, p->peHeader.nt, p->internal->secs)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_SECT);
    return nullptr;
  }

  if (!getResources(remaining, file, p->internal->secs, p->internal->rsrcs)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_RESC);
    return nullptr;
  }

  // Get exports
  if (!getExports(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  // Get relocations, if exist
  if (!getRelocations(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  if (!getDebugDir(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  // Get imports
  if (!getImports(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    return nullptr;
  }

  // Get symbol table
  if (!getSymbolTable(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    return nullptr;
  }

  deleteBuffer(remaining);

  return p;
}